

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a2.cpp
# Opt level: O1

void msd_A2_adaptive(cacheblock_t *cache,size_t N,size_t cache_depth,size_t true_depth,
                    TempSpace *tmp)

{
  size_t sVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  undefined4 uVar5;
  ushort uVar6;
  long *__ptr;
  uchar *puVar7;
  cacheblock_t *pcVar8;
  long lVar9;
  unsigned_long uVar10;
  long lVar11;
  cacheblock_t *pcVar12;
  uint i;
  size_t __n;
  
  if (0xffff < N) {
    if (3 < cache_depth) {
      fill_cache(cache,N,true_depth);
      cache_depth = 0;
    }
    TempSpace::allocate(tmp,N);
    __ptr = (long *)calloc(0x10000,8);
    lVar11 = N + (N == 0);
    puVar7 = cache->bytes + cache_depth + 1;
    lVar9 = lVar11;
    do {
      __ptr[(ushort)(*(ushort *)(puVar7 + -1) << 8 | *(ushort *)(puVar7 + -1) >> 8)] =
           __ptr[(ushort)(*(ushort *)(puVar7 + -1) << 8 | *(ushort *)(puVar7 + -1) >> 8)] + 1;
      puVar7 = puVar7 + 0x10;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    msd_A2_adaptive::bucketindex._M_elems[0] = 0;
    lVar9 = 0;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + __ptr[lVar9];
      msd_A2_adaptive::bucketindex._M_elems[lVar9 + 1] = uVar10;
      lVar9 = lVar9 + 1;
      pcVar12 = cache;
    } while (lVar9 != 0xffff);
    do {
      uVar6 = *(ushort *)(pcVar12->bytes + cache_depth) << 8 |
              *(ushort *)(pcVar12->bytes + cache_depth) >> 8;
      sVar1 = msd_A2_adaptive::bucketindex._M_elems[uVar6];
      msd_A2_adaptive::bucketindex._M_elems[uVar6] = sVar1 + 1;
      pcVar8 = TempSpace::operator[](tmp,sVar1);
      uVar2 = pcVar12->bytes[1];
      uVar3 = pcVar12->bytes[2];
      uVar4 = pcVar12->bytes[3];
      uVar5 = *(undefined4 *)&pcVar12->field_0x4;
      puVar7 = pcVar12->ptr;
      pcVar8->bytes[0] = pcVar12->bytes[0];
      pcVar8->bytes[1] = uVar2;
      pcVar8->bytes[2] = uVar3;
      pcVar8->bytes[3] = uVar4;
      *(undefined4 *)&pcVar8->field_0x4 = uVar5;
      pcVar8->ptr = puVar7;
      lVar11 = lVar11 + -1;
      pcVar12 = pcVar12 + 1;
    } while (lVar11 != 0);
    pcVar12 = tmp->strings;
    if (tmp->elements_in_strings < N) {
      memcpy(cache,pcVar12,tmp->elements_in_strings << 4);
      pcVar12 = tmp->allocated;
      __n = (N - tmp->elements_in_strings) * 0x10;
      pcVar8 = cache + tmp->elements_in_strings;
    }
    else {
      __n = N << 4;
      pcVar8 = cache;
    }
    memcpy(pcVar8,pcVar12,__n);
    if (tmp->allocated != (cacheblock_t *)0x0) {
      free(tmp->allocated);
      tmp->allocated = (cacheblock_t *)0x0;
    }
    lVar9 = *__ptr;
    lVar11 = 1;
    do {
      sVar1 = __ptr[lVar11];
      if (sVar1 != 0) {
        if ((char)lVar11 != '\0') {
          msd_A2_adaptive(cache + lVar9,sVar1,cache_depth + 2,true_depth + 2,tmp);
        }
        lVar9 = lVar9 + sVar1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x10000);
    free(__ptr);
    return;
  }
  msd_A2(cache,N,cache_depth,true_depth,tmp);
  return;
}

Assistant:

static void
msd_A2_adaptive(cacheblock_t* cache,
                size_t N,
                size_t cache_depth,
                size_t true_depth,
                TempSpace& tmp)
{
	if (N < 0x10000) {
		msd_A2(cache, N, cache_depth, true_depth, tmp);
		return;
	}
	if (cache_depth >= CACHED_BYTES) {
		fill_cache(cache, N, true_depth);
		cache_depth = 0;
	}
	tmp.allocate(N);
	size_t* bucketsize = static_cast<size_t*>(calloc(0x10000,
				sizeof(size_t)));
	for (size_t i=0; i < N; ++i) {
		uint16_t bucket =
			(cache[i].bytes[cache_depth] << 8) |
			 cache[i].bytes[cache_depth+1];
		++bucketsize[bucket];
	}
	static std::array<size_t, 0x10000> bucketindex;
	bucketindex[0] = 0;
	for (unsigned i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
	for (size_t i=0; i < N; ++i) {
		uint16_t bucket = (cache[i].bytes[cache_depth] << 8)
			| cache[i].bytes[cache_depth+1];
		tmp[bucketindex[bucket]++] = cache[i];
	}
	copy(tmp, cache, N);
	tmp.deallocate();
	size_t bsum = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_A2_adaptive(cache+bsum, bucketsize[i],
				cache_depth+2, true_depth+2, tmp);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}